

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O0

Vec_Ptr_t * Abc_NodeFindCut(Abc_ManCut_t *p,Abc_Obj_t *pRoot,int fContain)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  void *Entry;
  int local_34;
  int i;
  Abc_Obj_t *pNode;
  int fContain_local;
  Abc_Obj_t *pRoot_local;
  Abc_ManCut_t *p_local;
  
  iVar2 = Abc_ObjIsComplement(pRoot);
  if (iVar2 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                  ,0x105,"Vec_Ptr_t *Abc_NodeFindCut(Abc_ManCut_t *, Abc_Obj_t *, int)");
  }
  iVar2 = Abc_ObjIsNode(pRoot);
  if (iVar2 == 0) {
    __assert_fail("Abc_ObjIsNode(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                  ,0x106,"Vec_Ptr_t *Abc_NodeFindCut(Abc_ManCut_t *, Abc_Obj_t *, int)");
  }
  Vec_PtrClear(p->vVisited);
  Vec_PtrPush(p->vVisited,pRoot);
  pVVar1 = p->vVisited;
  pAVar3 = Abc_ObjFanin0(pRoot);
  Vec_PtrPush(pVVar1,pAVar3);
  pVVar1 = p->vVisited;
  pAVar3 = Abc_ObjFanin1(pRoot);
  Vec_PtrPush(pVVar1,pAVar3);
  *(uint *)&pRoot->field_0x14 = *(uint *)&pRoot->field_0x14 & 0xffffffdf | 0x20;
  pAVar3 = Abc_ObjFanin0(pRoot);
  *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffdf | 0x20;
  pAVar3 = Abc_ObjFanin1(pRoot);
  *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffdf | 0x20;
  Vec_PtrClear(p->vNodeLeaves);
  pVVar1 = p->vNodeLeaves;
  pAVar3 = Abc_ObjFanin0(pRoot);
  Vec_PtrPush(pVVar1,pAVar3);
  pVVar1 = p->vNodeLeaves;
  pAVar3 = Abc_ObjFanin1(pRoot);
  Vec_PtrPush(pVVar1,pAVar3);
  do {
    iVar2 = Abc_NodeBuildCutLevelOne_int(p->vVisited,p->vNodeLeaves,p->nNodeSizeMax,p->nNodeFanStop)
    ;
  } while (iVar2 != 0);
  iVar2 = Vec_PtrSize(p->vNodeLeaves);
  if (p->nNodeSizeMax < iVar2) {
    __assert_fail("Vec_PtrSize(p->vNodeLeaves) <= p->nNodeSizeMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                  ,0x118,"Vec_Ptr_t *Abc_NodeFindCut(Abc_ManCut_t *, Abc_Obj_t *, int)");
  }
  if (fContain == 0) {
    Abc_NodesUnmarkB(p->vVisited);
    p_local = (Abc_ManCut_t *)p->vNodeLeaves;
  }
  else {
    if (p->nConeSizeMax <= p->nNodeSizeMax) {
      __assert_fail("p->nNodeSizeMax < p->nConeSizeMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                    ,0x124,"Vec_Ptr_t *Abc_NodeFindCut(Abc_ManCut_t *, Abc_Obj_t *, int)");
    }
    Vec_PtrClear(p->vConeLeaves);
    for (local_34 = 0; iVar2 = Vec_PtrSize(p->vNodeLeaves), local_34 < iVar2;
        local_34 = local_34 + 1) {
      Entry = Vec_PtrEntry(p->vNodeLeaves,local_34);
      Vec_PtrPush(p->vConeLeaves,Entry);
    }
    do {
      iVar2 = Abc_NodeBuildCutLevelOne_int
                        (p->vVisited,p->vConeLeaves,p->nConeSizeMax,p->nConeFanStop);
    } while (iVar2 != 0);
    iVar2 = Vec_PtrSize(p->vConeLeaves);
    if (p->nConeSizeMax < iVar2) {
      __assert_fail("Vec_PtrSize(p->vConeLeaves) <= p->nConeSizeMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                    ,299,"Vec_Ptr_t *Abc_NodeFindCut(Abc_ManCut_t *, Abc_Obj_t *, int)");
    }
    Abc_NodesUnmarkB(p->vVisited);
    p_local = (Abc_ManCut_t *)p->vNodeLeaves;
  }
  return (Vec_Ptr_t *)p_local;
}

Assistant:

Vec_Ptr_t * Abc_NodeFindCut( Abc_ManCut_t * p, Abc_Obj_t * pRoot, int fContain )
{
    Abc_Obj_t * pNode;
    int i;

    assert( !Abc_ObjIsComplement(pRoot) );
    assert( Abc_ObjIsNode(pRoot) );

    // start the visited nodes and mark them
    Vec_PtrClear( p->vVisited );
    Vec_PtrPush( p->vVisited, pRoot );
    Vec_PtrPush( p->vVisited, Abc_ObjFanin0(pRoot) );
    Vec_PtrPush( p->vVisited, Abc_ObjFanin1(pRoot) );
    pRoot->fMarkB = 1;
    Abc_ObjFanin0(pRoot)->fMarkB = 1;
    Abc_ObjFanin1(pRoot)->fMarkB = 1;

    // start the cut 
    Vec_PtrClear( p->vNodeLeaves );
    Vec_PtrPush( p->vNodeLeaves, Abc_ObjFanin0(pRoot) );
    Vec_PtrPush( p->vNodeLeaves, Abc_ObjFanin1(pRoot) );

    // compute the cut
    while ( Abc_NodeBuildCutLevelOne_int( p->vVisited, p->vNodeLeaves, p->nNodeSizeMax, p->nNodeFanStop ) );
    assert( Vec_PtrSize(p->vNodeLeaves) <= p->nNodeSizeMax );

    // return if containing cut is not requested
    if ( !fContain )
    {
        // unmark both fMarkA and fMarkB in tbe TFI
        Abc_NodesUnmarkB( p->vVisited );
        return p->vNodeLeaves;
    }

//printf( "\n\n\n" );
    // compute the containing cut
    assert( p->nNodeSizeMax < p->nConeSizeMax );
    // copy the current boundary
    Vec_PtrClear( p->vConeLeaves );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodeLeaves, pNode, i )
        Vec_PtrPush( p->vConeLeaves, pNode );
    // compute the containing cut
    while ( Abc_NodeBuildCutLevelOne_int( p->vVisited, p->vConeLeaves, p->nConeSizeMax, p->nConeFanStop ) );
    assert( Vec_PtrSize(p->vConeLeaves) <= p->nConeSizeMax );
    // unmark TFI using fMarkA and fMarkB
    Abc_NodesUnmarkB( p->vVisited );
    return p->vNodeLeaves;
}